

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spl_inl.h
# Opt level: O0

int16_t WebRtcSpl_NormW32(int32_t a)

{
  undefined2 local_12;
  undefined4 local_10;
  int16_t zeros;
  int32_t a_local;
  
  if (a == 0) {
    zeros = 0;
  }
  else {
    local_10 = a;
    if (a < 0) {
      local_10 = a ^ 0xffffffff;
    }
    if ((local_10 & 0xffff8000) == 0) {
      local_12 = 0x10;
    }
    else {
      local_12 = 0;
    }
    if ((local_10 << (sbyte)local_12 & 0xff800000) == 0) {
      local_12 = local_12 + 8;
    }
    if ((local_10 << ((byte)local_12 & 0x1f) & 0xf8000000) == 0) {
      local_12 = local_12 + 4;
    }
    if ((local_10 << ((byte)local_12 & 0x1f) & 0xe0000000) == 0) {
      local_12 = local_12 + 2;
    }
    if ((local_10 << ((byte)local_12 & 0x1f) & 0xc0000000) == 0) {
      local_12 = local_12 + 1;
    }
    zeros = local_12;
  }
  return zeros;
}

Assistant:

static __inline int16_t WebRtcSpl_NormW32(int32_t a) {
  int16_t zeros;

  if (a == 0) {
    return 0;
  }
  else if (a < 0) {
    a = ~a;
  }

  if (!(0xFFFF8000 & a)) {
    zeros = 16;
  } else {
    zeros = 0;
  }
  if (!(0xFF800000 & (a << zeros))) zeros += 8;
  if (!(0xF8000000 & (a << zeros))) zeros += 4;
  if (!(0xE0000000 & (a << zeros))) zeros += 2;
  if (!(0xC0000000 & (a << zeros))) zeros += 1;

  return zeros;
}